

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O1

int __thiscall
CVmObjVector::getp_get_size(CVmObjVector *this,vm_obj_id_t param_1,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  int iVar2;
  
  if (getp_get_size(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_size();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_size::desc);
  if (iVar2 == 0) {
    uVar1 = *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    retval->typ = VM_INT;
    *(uint *)&retval->val = (uint)uVar1;
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_get_size(VMG_ vm_obj_id_t, vm_val_t *retval,
                                uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* return my element count */
    retval->set_int(get_element_count());

    /* handled */
    return TRUE;
}